

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O0

void __thiscall cppcms::archive_error::archive_error(archive_error *this,string *e)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  char *in_RDI;
  string *s;
  runtime_error *in_stack_ffffffffffffffc0;
  string local_30;
  
  s = &local_30;
  std::operator+(in_RDI,in_RSI);
  booster::runtime_error::runtime_error(in_stack_ffffffffffffffc0,s);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)in_RDI = &PTR__archive_error_0052f958;
  *(undefined ***)(in_RDI + 0x10) = &PTR__archive_error_0052f980;
  return;
}

Assistant:

archive_error(std::string const &e) : booster::runtime_error("cppcms::archive_error: " + e)
		{
		}